

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O1

pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> * __thiscall
docopt::Argument::single_match
          (pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *__return_storage_ptr__,
          Argument *this,PatternList *left)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *ppVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  int iVar5;
  long lVar6;
  undefined4 extraout_var;
  pointer psVar7;
  long lVar8;
  unsigned_long uVar9;
  undefined1 local_51;
  pair<unsigned_long,_std::shared_ptr<docopt::LeafPattern>_> *local_50;
  element_type *local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  Argument *local_38;
  
  __return_storage_ptr__->first = 0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->second).
  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  lVar8 = (long)(left->
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(left->
                super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
  local_50 = __return_storage_ptr__;
  if (lVar8 != 0) {
    lVar8 = lVar8 >> 4;
    psVar7 = (left->
             super__Vector_base<std::shared_ptr<docopt::Pattern>,_std::allocator<std::shared_ptr<docopt::Pattern>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar9 = 0;
    local_38 = this;
    do {
      peVar1 = (psVar7->super___shared_ptr<docopt::Pattern,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      if (peVar1 == (element_type *)0x0) {
        lVar6 = 0;
      }
      else {
        lVar6 = __dynamic_cast(peVar1,&Pattern::typeinfo,&typeinfo,0);
      }
      ppVar2 = local_50;
      if (lVar6 != 0) {
        local_50->first = uVar9;
        iVar5 = (*(local_38->super_LeafPattern).super_Pattern._vptr_Pattern[3])();
        local_48 = (element_type *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
        __shared_count<docopt::Argument,std::allocator<docopt::Argument>,std::__cxx11::string_const&,docopt::value_const&>
                  (&_Stack_40,(Argument **)&local_48,(allocator<docopt::Argument> *)&local_51,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar5),(value *)(lVar6 + 0x28));
        _Var4._M_pi = _Stack_40._M_pi;
        peVar3 = local_48;
        local_48 = (element_type *)0x0;
        _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        this_00 = (ppVar2->second).
                  super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        (ppVar2->second).super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>._M_ptr
             = peVar3;
        (ppVar2->second).super___shared_ptr<docopt::LeafPattern,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = _Var4._M_pi;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        }
        if (_Stack_40._M_pi == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          return local_50;
        }
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_40._M_pi);
        return local_50;
      }
      uVar9 = uVar9 + 1;
      psVar7 = psVar7 + 1;
    } while (lVar8 + (ulong)(lVar8 == 0) != uVar9);
  }
  return local_50;
}

Assistant:

inline std::pair<size_t, std::shared_ptr<LeafPattern>> Argument::single_match(PatternList const& left) const
	{
		std::pair<size_t, std::shared_ptr<LeafPattern>> ret {};

		for(size_t i = 0, size = left.size(); i < size; ++i)
		{
			auto arg = dynamic_cast<Argument const*>(left[i].get());
			if (arg) {
				ret.first = i;
				ret.second = std::make_shared<Argument>(name(), arg->getValue());
				break;
			}
		}

		return ret;
	}